

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

MangledEntryName *
duckdb::DependencyManager::MangleName(MangledEntryName *__return_storage_ptr__,CatalogEntry *entry)

{
  CatalogType CVar1;
  int iVar2;
  undefined4 extraout_var;
  CatalogEntry *in_RDX;
  DependencyEntry *dependency_entry;
  string name;
  string schema;
  CatalogEntryInfo info;
  string local_a0 [32];
  string local_80;
  undefined1 local_60 [40];
  string local_38 [32];
  
  CVar1 = entry->type;
  if (CVar1 == DEPENDENCY_ENTRY) {
    iVar2 = (*entry->_vptr_CatalogEntry[0x11])(entry);
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar2));
  }
  else {
    GetSchema_abi_cxx11_(&local_80,(DependencyManager *)entry,in_RDX);
    ::std::__cxx11::string::string(local_a0,(string *)&entry->name);
    local_60[0] = CVar1;
    ::std::__cxx11::string::string((string *)(local_60 + 8),(string *)&local_80);
    ::std::__cxx11::string::string(local_38,local_a0);
    MangledEntryName::MangledEntryName(__return_storage_ptr__,(CatalogEntryInfo *)local_60);
    CatalogEntryInfo::~CatalogEntryInfo((CatalogEntryInfo *)local_60);
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

MangledEntryName DependencyManager::MangleName(const CatalogEntry &entry) {
	if (entry.type == CatalogType::DEPENDENCY_ENTRY) {
		auto &dependency_entry = entry.Cast<DependencyEntry>();
		return dependency_entry.EntryMangledName();
	}
	auto type = entry.type;
	auto schema = GetSchema(entry);
	auto name = entry.name;
	CatalogEntryInfo info {type, schema, name};

	return MangleName(info);
}